

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viewer.c
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  size_t sVar8;
  undefined8 uVar9;
  int y;
  uint uVar10;
  uint16_t *puVar11;
  char *pcVar12;
  long lVar13;
  uint8_t uVar14;
  uint16_t *__ptr;
  float fVar15;
  double dVar16;
  uint8_t (*rgb) [60] [80] [3];
  uint local_2618;
  float local_2614;
  long local_2610;
  long local_2608;
  FILE *local_2600;
  long local_25f8;
  SDL_Event e;
  uint16_t y16 [60] [80];
  
  if (argc - 5U < 0xfffffffd) {
    iVar3 = -1;
    printf("Displays frames in file created by pt1cap\n\nUsage: %s <filename> [blue_level red_level]\n\n"
           ,*argv);
  }
  else {
    printf("%i\n",argc);
    if ((uint)argc < 4) {
      lVar5 = -0xd48;
      local_2614 = 0.51;
    }
    else {
      lVar5 = atol(argv[2]);
      lVar5 = -lVar5;
      dVar16 = atof(argv[3]);
      local_2614 = (float)(255.0 / ((double)lVar5 + dVar16));
      printf("%li %f\n",(double)local_2614,lVar5);
    }
    local_2600 = fopen(argv[1],"r");
    puts(argv[1]);
    iVar3 = SDL_Init(0x20);
    if (iVar3 < 0) {
      uVar9 = SDL_GetError();
      pcVar12 = "Couldn\'t initialize SDL: %s";
    }
    else {
      lVar6 = SDL_CreateWindow("Bat Drone Ground Station",0x1fff0000,0x1fff0000,0x280,0x1e0,0x20);
      if (lVar6 == 0) {
        uVar9 = SDL_GetError();
        pcVar12 = "Couldn\'t create window: %s";
      }
      else {
        SDL_DisableScreenSaver();
        lVar7 = SDL_CreateRenderer(lVar6,0xffffffffffffffff,0);
        if (lVar7 == 0) {
          uVar9 = SDL_GetError();
          pcVar12 = "Couldn\'t create renderer: %s";
        }
        else {
          local_2610 = SDL_CreateTexture(lVar7,0x17101803,1,0x50,0x3c);
          if (local_2610 != 0) {
            bVar2 = false;
            uVar10 = 0;
            local_2608 = lVar7;
            local_25f8 = lVar6;
LAB_00101442:
            bVar1 = true;
            local_2618 = 0;
            do {
              if (!bVar1) {
                fclose(local_2600);
                SDL_DestroyRenderer(local_2608);
                SDL_DestroyWindow(local_25f8);
                SDL_Quit();
                return 0;
              }
              iVar3 = SDL_GetTicks();
              if (local_2618 == 0 && !bVar2) {
                uVar10 = uVar10 + 1;
                __ptr = y16[0];
                sVar8 = fread(__ptr,0x2580,1,local_2600);
                if (sVar8 == 0) goto LAB_0010167a;
                SDL_LockTexture(local_2610,0,&rgb,&e);
                lVar6 = 0;
                for (lVar7 = 0; lVar7 != 0x3c; lVar7 = lVar7 + 1) {
                  puVar11 = __ptr;
                  for (lVar13 = 0; lVar13 != 0xf0; lVar13 = lVar13 + 3) {
                    fVar15 = (float)(long)((ulong)*puVar11 + lVar5) * local_2614;
                    if (fVar15 <= 255.0) {
                      if (0.0 <= fVar15) {
                        uVar14 = (uint8_t)(int)fVar15;
                        (*rgb)[0][0][lVar13 + 2 + lVar6] = uVar14;
                        (*rgb)[0][0][lVar13 + 1 + lVar6] = uVar14;
                        (*rgb)[0][0][lVar13 + lVar6] = uVar14;
                      }
                      else {
                        (*rgb)[0][0][lVar13 + lVar6] = '\0';
                        (*rgb)[0][0][lVar13 + 1 + lVar6] = '\0';
                        (*rgb)[0][0][lVar13 + 2 + lVar6] = 0xff;
                      }
                    }
                    else {
                      (*rgb)[0][0][lVar13 + lVar6] = 0xff;
                      (*rgb)[0][0][lVar13 + 1 + lVar6] = '\0';
                      (*rgb)[0][0][lVar13 + 2 + lVar6] = '\0';
                    }
                    puVar11 = puVar11 + 1;
                  }
                  __ptr = __ptr + 0x50;
                  lVar6 = lVar6 + 0xf0;
                }
                SDL_UnlockTexture(local_2610);
                lVar6 = local_2608;
                SDL_SetRenderDrawColor(local_2608,0xff,0xff,0xff,0xff);
                SDL_RenderClear(lVar6);
                SDL_RenderCopy(lVar6,local_2610,0,0);
                SDL_RenderPresent(lVar6);
                uVar4 = SDL_GetTicks();
                if (uVar4 < iVar3 + 0x28U) {
                  SDL_Delay();
                }
                bVar2 = false;
              }
              bVar1 = true;
              while (iVar3 = SDL_PollEvent(&e), iVar3 != 0) {
                if (e.type == 0x402) {
                  printf("frame %i\ncoord %i,%i\nintensity %u\n",(ulong)uVar10,
                         (long)(e.window.data2 / 8),(long)(e.motion.y / 8),
                         (ulong)y16[e.motion.y / 8][e.window.data2 / 8]);
                }
                else if (e.type == 0x100) {
                  bVar1 = false;
                }
                else if (e.type == 0x300) {
                  local_2618 = (uint)(local_2618 == 0);
                }
              }
            } while( true );
          }
          uVar9 = SDL_GetError();
          pcVar12 = "Couldn\'t create texture: %s";
        }
      }
    }
    SDL_LogError(0,pcVar12,uVar9);
    iVar3 = 3;
  }
  return iVar3;
LAB_0010167a:
  puts("End of file");
  bVar2 = true;
  goto LAB_00101442;
}

Assistant:

int main(int argc, char* argv[]) {
  if (argc > 4 || argc < 2) {
    printf(
      "Displays frames in file created by pt1cap\n"\
      "\n"\
      "Usage: %s <filename> [blue_level red_level]\n"\
      "\n"\
    , argv[0]);
    return -1;
  }
  int paused = 0;
  int frame = 0;
  int end = 0;
  int run = 1;
  long offset;
  float scale;
  printf("%i\n", argc);
  if(argc > 3) {
    offset = -atol(argv[2]);
    scale = 255.0 / (atof(argv[3]) + offset);
    printf("%li %f\n", offset, scale);
  } else {
    // 3400 to 3900 is human
    offset = -3400; // to 3800
    scale = 255.0/(3900-3400);
  }

  FILE *fd = fopen(argv[1], "r");
  printf("%s\n", argv[1]);

  SDL_Window *window;
  SDL_Renderer *renderer;
  SDL_Texture *texture;


  if (SDL_Init(SDL_INIT_VIDEO) < 0) {
    SDL_LogError(SDL_LOG_CATEGORY_APPLICATION, "Couldn't initialize SDL: %s", SDL_GetError());
    return 3;
  }
  if (!(window = SDL_CreateWindow("Bat Drone Ground Station", SDL_WINDOWPOS_UNDEFINED, SDL_WINDOWPOS_UNDEFINED, 640, 480, SDL_WINDOW_RESIZABLE))) {
    SDL_LogError(SDL_LOG_CATEGORY_APPLICATION, "Couldn't create window: %s", SDL_GetError());
    return 3;
  }
  SDL_DisableScreenSaver();
  if (!(renderer = SDL_CreateRenderer(window, -1, 0))) {
    SDL_LogError(SDL_LOG_CATEGORY_APPLICATION, "Couldn't create renderer: %s", SDL_GetError());
    return 3;
  }
  if (!(texture = SDL_CreateTexture(renderer, SDL_PIXELFORMAT_RGB24, SDL_TEXTUREACCESS_STREAMING, 80, 60))) {
    SDL_LogError(SDL_LOG_CATEGORY_APPLICATION, "Couldn't create texture: %s", SDL_GetError());
    return 3;
  }

  const int w = 80;
  const int h = 60;
  const int r = 0;
  const int g = 1;
  const int b = 2;
  while(run) {
    unsigned long next_ticks = SDL_GetTicks() + 40;
    uint16_t y16[60][80];
    uint8_t (*rgb)[60][80][3];
    if(!paused && !end) {
      frame++;
      int pitch;
      if(!fread((void *) &y16, sizeof(y16), 1, fd)) {
        printf("End of file\n");
        end = 1;
        continue;
      }
      SDL_LockTexture(texture, NULL, (void **) &rgb, &pitch);
      for (int y = 0; y < h; y++) {
        for (int x = 0; x < w; x++) {
          float pixel = ((float) (y16[y][x] + offset)) * scale;
          if (pixel > 0xFF) {
            (*rgb)[y][x][r] = 0xFF;
            (*rgb)[y][x][g] = 0;
            (*rgb)[y][x][b] = 0;
          } else if (pixel < 0) {
            (*rgb)[y][x][r] = 0;
            (*rgb)[y][x][g] = 0;
            (*rgb)[y][x][b] = 0xFF;
          } else {
            (*rgb)[y][x][r] = (*rgb)[y][x][g] = (*rgb)[y][x][b] = pixel;
          }
        }
      }
      SDL_UnlockTexture(texture);
      SDL_SetRenderDrawColor(renderer, 255, 255, 255, 255);
      SDL_RenderClear(renderer);
      SDL_RenderCopy(renderer, texture, NULL, NULL);
      SDL_RenderPresent(renderer);
      unsigned long ticks = SDL_GetTicks();
      if (ticks < next_ticks) {
        SDL_Delay(next_ticks - ticks);
      }
    }
    SDL_Event e;
    while(SDL_PollEvent(&e)) {
      int x, y;
      switch(e.type) {
      case SDL_QUIT:
        run = 0;
        break;
      case SDL_KEYDOWN:
        paused = !paused;
        break;
      case SDL_MOUSEBUTTONUP:
        x = e.button.x * 80 / 640;
        y = e.button.y * 60 / 480;
        printf("frame %i\ncoord %i,%i\nintensity %u\n", frame, x, y, y16[y][x]);
      }
    }
  }
  fclose(fd);

  SDL_DestroyRenderer(renderer);
  SDL_DestroyWindow(window);
  SDL_Quit();
  return 0;
}